

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeSIMDShuffle<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  optional<unsigned_char> oVar1;
  int iVar2;
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  iVar2 = 0x11;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    oVar1 = Lexer::takeU<unsigned_char>(&ctx->in);
  } while (((ushort)oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_char> >> 8 & 1) != 0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"expected lane index",&local_21);
  Lexer::err(&local_48,&ctx->in,&local_68);
  std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
  _Variant_storage<1ul,wasm::Err>
            ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDShuffle(Ctx& ctx,
                         Index pos,
                         const std::vector<Annotation>& annotations) {
  std::array<uint8_t, 16> lanes;
  for (int i = 0; i < 16; ++i) {
    auto lane = ctx.in.takeU8();
    if (!lane) {
      return ctx.in.err("expected lane index");
    }
    lanes[i] = *lane;
  }
  return ctx.makeSIMDShuffle(pos, annotations, lanes);
}